

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

QPDFExc * __thiscall
QPDF::damagedPDF(QPDFExc *__return_storage_ptr__,QPDF *this,string *object,string *message)

{
  pointer pMVar1;
  element_type *this_00;
  qpdf_offset_t offset;
  string *message_local;
  string *object_local;
  QPDF *this_local;
  
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  this_00 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar1->file);
  offset = InputSource::getLastOffset(this_00);
  damagedPDF(__return_storage_ptr__,this,object,offset,message);
  return __return_storage_ptr__;
}

Assistant:

QPDFExc
QPDF::damagedPDF(std::string const& object, std::string const& message)
{
    return damagedPDF(object, m->file->getLastOffset(), message);
}